

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

void __thiscall QRegion::QRegion(QRegion *this,QBitmap *bm)

{
  bool bVar1;
  void *pvVar2;
  QRegionPrivate *pQVar3;
  QPixmap *in_RSI;
  long *in_RDI;
  QBitmap *in_stack_00000040;
  
  bVar1 = QPixmap::isNull(in_RSI);
  if (bVar1) {
    *in_RDI = (long)&shared_empty;
  }
  else {
    pvVar2 = operator_new(0x10);
    *in_RDI = (long)pvVar2;
    QtPrivate::RefCount::initializeOwned((RefCount *)0x655357);
    pQVar3 = qt_bitmapToRegion(in_stack_00000040);
    *(QRegionPrivate **)(*in_RDI + 8) = pQVar3;
  }
  return;
}

Assistant:

QRegion::QRegion(const QBitmap &bm)
{
    if (bm.isNull()) {
        d = const_cast<QRegionData*>(&shared_empty);
    } else {
        d = new QRegionData;
        d->ref.initializeOwned();
        d->qt_rgn = qt_bitmapToRegion(bm);
    }
}